

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O3

UChar * __thiscall
icu_63::number::impl::CompactData::getPattern(CompactData *this,int32_t magnitude,Form plural)

{
  UChar *pUVar1;
  char16_t *pcVar2;
  
  if (-1 < magnitude) {
    if (this->largestMagnitude < magnitude) {
      magnitude = (int)this->largestMagnitude;
    }
    pcVar2 = this->patterns[(int)(magnitude * 6 + plural)];
    if ((plural != OTHER) && (pcVar2 == (char16_t *)0x0)) {
      pcVar2 = this->patterns[(long)(magnitude * 6) + 5];
    }
    pUVar1 = (UChar *)0x0;
    if (pcVar2 != L"<USE FALLBACK>") {
      pUVar1 = pcVar2;
    }
    return pUVar1;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *CompactData::getPattern(int32_t magnitude, StandardPlural::Form plural) const {
    if (magnitude < 0) {
        return nullptr;
    }
    if (magnitude > largestMagnitude) {
        magnitude = largestMagnitude;
    }
    const UChar *patternString = patterns[getIndex(magnitude, plural)];
    if (patternString == nullptr && plural != StandardPlural::OTHER) {
        // Fall back to "other" plural variant
        patternString = patterns[getIndex(magnitude, StandardPlural::OTHER)];
    }
    if (patternString == USE_FALLBACK) { // == is intended
        // Return null if USE_FALLBACK is present
        patternString = nullptr;
    }
    return patternString;
}